

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  byte bVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  char *begin;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  scoped_padder p;
  ulong local_88 [2];
  scoped_padder local_78;
  buffer<char> local_50;
  memory_buf_t *local_30;
  
  scoped_padder::scoped_padder(&local_78,0xb,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = tm_time->tm_hour;
  uVar5 = uVar1 - 0xc;
  if ((int)uVar1 < 0xd) {
    uVar5 = uVar1;
  }
  if (uVar5 < 100) {
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    bVar2 = (byte)((uVar5 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = bVar2 | 0x30;
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = (char)uVar5 + bVar2 * -10 | 0x30;
  }
  else {
    local_88[0] = (ulong)uVar5;
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001cb9a0;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args.desc_ = 1;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt,args,(locale_ref)0x0);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  uVar6 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar4] = ':';
  uVar1 = tm_time->tm_min;
  if ((ulong)uVar1 < 100) {
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    bVar2 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = bVar2 | 0x30;
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = (char)uVar1 + bVar2 * -10 | 0x30;
  }
  else {
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001cb9a0;
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args_00.desc_ = 1;
    local_88[0] = (ulong)uVar1;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt_00,args_00,(locale_ref)0x0);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  uVar6 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar4] = ':';
  uVar1 = tm_time->tm_sec;
  if ((ulong)uVar1 < 100) {
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    bVar2 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = bVar2 | 0x30;
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar6 = sVar4 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar4] = (char)uVar1 + bVar2 * -10 | 0x30;
  }
  else {
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001cb9a0;
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args_01.desc_ = 1;
    local_88[0] = (ulong)uVar1;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt_01,args_01,(locale_ref)0x0);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  uVar6 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar6 = sVar4 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar4] = ' ';
  begin = "AM";
  if (0xb < tm_time->tm_hour) {
    begin = "PM";
  }
  pcVar3 = "AM";
  if (0xb < tm_time->tm_hour) {
    pcVar3 = "PM";
  }
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,begin,pcVar3 + 2);
  scoped_padder::~scoped_padder(&local_78);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }